

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O0

uint8_t * apx_attributeParser_parse_value_table_arg
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,
                    apx_attributeParserValueTableState_t *vts)

{
  byte bVar1;
  ushort **ppuVar2;
  adt_str_t *str_00;
  adt_str_t *str;
  uint8_t c;
  uint8_t *puStack_48;
  _Bool unary_minus;
  uint8_t *result;
  uint8_t *puStack_38;
  apx_argumentType_t arg_type;
  uint8_t *next;
  apx_attributeParserValueTableState_t *vts_local;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_attributeParser_t *self_local;
  
  puStack_38 = begin;
  if (begin < end) {
    result._7_1_ = '\0';
    puStack_48 = (uint8_t *)0x0;
    str._7_1_ = false;
    if ((vts->last_was_string & 1U) == 0) {
      bVar1 = *begin;
      if (bVar1 == 0x22) {
        result._7_1_ = '\x02';
      }
      else if (bVar1 == 0x2d) {
        str._7_1_ = true;
        puStack_38 = begin + 1;
        result._7_1_ = '\x01';
      }
      else {
        ppuVar2 = __ctype_b_loc();
        result._7_1_ = ((*ppuVar2)[(int)(uint)bVar1] & 0x800) != 0;
      }
    }
    else if (*begin == '\"') {
      result._7_1_ = '\x02';
    }
    if (result._7_1_ == '\0') {
      puStack_38 = (uint8_t *)0x0;
    }
    else if (result._7_1_ == '\x01') {
      if (vts->num_count == 0) {
        puStack_48 = apx_attributeParser_parse_lower_limit(puStack_38,end,str._7_1_,&vts->range);
      }
      else if (vts->num_count == 1) {
        puStack_48 = apx_attributeParser_parse_upper_limit(puStack_38,end,str._7_1_,&vts->range);
      }
      else {
        puStack_48 = (uint8_t *)0x0;
      }
      if (puStack_38 < puStack_48) {
        puStack_38 = puStack_48;
      }
      vts->num_count = vts->num_count + 1;
    }
    else if (result._7_1_ == '\x02') {
      vts->last_was_string = true;
      puStack_48 = bstr_match_pair(puStack_38,end,'\"','\"','\\');
      if (puStack_38 < puStack_48) {
        str_00 = adt_str_new_bstr(puStack_38 + 1,puStack_48);
        if (str_00 == (adt_str_t *)0x0) {
          apx_attributeParser_set_error(self,2,puStack_38);
          return (uint8_t *)0x0;
        }
        apx_attributeParserValueTableState_append(vts,str_00);
        puStack_38 = puStack_48 + 1;
      }
    }
    if (puStack_48 == (uint8_t *)0x0) {
      apx_attributeParser_set_error(self,3,puStack_38);
      return (uint8_t *)0x0;
    }
  }
  return puStack_38;
}

Assistant:

static uint8_t const* apx_attributeParser_parse_value_table_arg(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, apx_attributeParserValueTableState_t* vts)
{
   uint8_t const* next = begin;
   if (next < end)
   {
      apx_argumentType_t arg_type = APX_ARGUMENT_TYPE_INVALID;
      uint8_t const* result = NULL;
      bool unary_minus = false;

      if (!vts->last_was_string)
      {
         //Determing if next character is a string or integer literal
         uint8_t c = *next;
         if (c == '"')
         {
            arg_type = APX_ARGUMENT_TYPE_STRING_LITERAL;
         }
         else if (c == '-')
         {
            unary_minus = true;
            next++;
            arg_type = APX_ARGUMENT_TYPE_INTEGER_LITERAL;
         }
         else if (isdigit((int)c))
         {
            arg_type = APX_ARGUMENT_TYPE_INTEGER_LITERAL;
         }
      }
      else
      {
         if (*next == '"')
         {
            arg_type = APX_ARGUMENT_TYPE_STRING_LITERAL;
         }
      }
      switch (arg_type)
      {
      case APX_ARGUMENT_TYPE_INVALID:
         next = NULL;
         break;
      case APX_ARGUMENT_TYPE_INTEGER_LITERAL:
         if (vts->num_count == 0)
         {
            result = apx_attributeParser_parse_lower_limit(next, end, unary_minus, &vts->range);
         }
         else if (vts->num_count == 1)
         {
            result = apx_attributeParser_parse_upper_limit(next, end, unary_minus, &vts->range);
         }
         else
         {
            result = NULL; //Three consecutive numbers not allowed
         }
         if (result > next)
         {
            next = result;
         }
         vts->num_count++;
         break;
      case APX_ARGUMENT_TYPE_STRING_LITERAL:
         vts->last_was_string = true;
         result = bstr_match_pair(next, end, '"', '"', '\\');
         if (result > next)
         {
            adt_str_t* str = adt_str_new_bstr(next + 1, result);
            if (str == NULL)
            {
               apx_attributeParser_set_error(self, APX_MEM_ERROR, next);
               return NULL; //TODO: clean memory
            }
            apx_attributeParserValueTableState_append(vts, str);
            next = result + 1; //skip past ending '"' character
         }
         break;
      }
      if (result == NULL)
      {
         apx_attributeParser_set_error(self, APX_PARSE_ERROR, next);
         return result;
      }
   }
   return next;

}